

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

void __thiscall QDockAreaLayout::removePlaceHolder(QDockAreaLayout *this,QString *name)

{
  QDockWidgetGroupWindow *this_00;
  long lVar1;
  Data *pDVar2;
  QDockAreaLayoutInfo *pQVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  QList<QDockWidgetGroupWindow_*> list;
  QList<int> local_98;
  QArrayData *local_78;
  long lStack_70;
  long local_68;
  QList<int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  indexOfPlaceHolder(&local_58,this,name);
  if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
    remove(this,(char *)&local_58);
  }
  local_78 = (QArrayData *)0x0;
  lStack_70 = 0;
  local_68 = 0;
  qt_qFindChildren_helper
            (this->mainWindow,0,0,&QDockWidgetGroupWindow::staticMetaObject,&local_78,0);
  lVar1 = lStack_70;
  if (local_68 != 0) {
    lVar4 = local_68 << 3;
    lVar5 = 0;
    do {
      this_00 = *(QDockWidgetGroupWindow **)(lVar1 + lVar5);
      pQVar3 = QDockWidgetGroupWindow::layoutInfo(this_00);
      QDockAreaLayoutInfo::indexOfPlaceHolder(&local_98,pQVar3,name);
      pDVar2 = local_58.d.d;
      local_58.d.size = local_98.d.size;
      local_58.d.ptr = local_98.d.ptr;
      local_58.d.d = local_98.d.d;
      local_98.d.size = 0;
      local_98.d.d = (Data *)0x0;
      local_98.d.ptr = (int *)0x0;
      if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar2->super_QArrayData,4,0x10);
        }
      }
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,4,0x10);
        }
      }
      if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
        pQVar3 = QDockWidgetGroupWindow::layoutInfo(this_00);
        QDockAreaLayoutInfo::remove(pQVar3,(char *)&local_58);
        QDockWidgetGroupWindow::destroyOrHideIfEmpty(this_00);
      }
      lVar5 = lVar5 + 8;
    } while (lVar4 != lVar5);
  }
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,8,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayout::removePlaceHolder(const QString &name)
{
    QList<int> index = indexOfPlaceHolder(name);
    if (!index.isEmpty())
        remove(index);
    const auto groups =
            mainWindow->findChildren<QDockWidgetGroupWindow *>(Qt::FindDirectChildrenOnly);
    for (QDockWidgetGroupWindow *dwgw : groups) {
        index = dwgw->layoutInfo()->indexOfPlaceHolder(name);
        if (!index.isEmpty()) {
            dwgw->layoutInfo()->remove(index);
            dwgw->destroyOrHideIfEmpty();
        }
    }
}